

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btok_cvc.c
# Opt level: O1

err_t btokKeypairVal(octet *privkey,size_t privkey_len,octet *pubkey,size_t pubkey_len)

{
  err_t eVar1;
  bign_params params [1];
  bign_params bStack_168;
  
  eVar1 = 0x1fa;
  if (privkey_len * 2 == pubkey_len) {
    eVar1 = btokParamsStd(&bStack_168,privkey_len);
    if (eVar1 == 0) {
      if (privkey_len == 0x18) {
        eVar1 = bign96KeypairVal(&bStack_168,privkey,pubkey);
      }
      else {
        eVar1 = bignKeypairVal(&bStack_168,privkey,pubkey);
      }
    }
  }
  return eVar1;
}

Assistant:

static err_t btokKeypairVal(const octet privkey[], size_t privkey_len,
	const octet pubkey[], size_t pubkey_len)
{
	err_t code;
	bign_params params[1];
	// входной еонтроль
	if (pubkey_len != 2 * privkey_len)
		return ERR_BAD_KEYPAIR;
	// загрузить параметры
	code = btokParamsStd(params, privkey_len);
	ERR_CALL_CHECK(code);
	// проверить пару ключей
	return privkey_len == 24 ? bign96KeypairVal(params, privkey, pubkey) :
		bignKeypairVal(params, privkey, pubkey);
}